

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makemon.c
# Opt level: O2

int max_monster_difficulty(d_level *dlev)

{
  xchar xVar1;
  int iVar2;
  int iVar3;
  
  xVar1 = level_difficulty(dlev);
  if ((u.uevent._1_1_ & 0x20) == 0) {
    iVar3 = (int)xVar1;
    if (in_mklev == '\0') {
      iVar2 = (iVar3 + u.ulevel) / 2;
    }
    else {
      iVar2 = (iVar3 - 10U >> 1) + 10;
      if (xVar1 < '\v') {
        iVar2 = iVar3;
      }
    }
  }
  else {
    iVar2 = 0x39;
  }
  return iVar2;
}

Assistant:

int max_monster_difficulty(const d_level *dlev)
{
	int zlevel = level_difficulty(dlev);
	if (u.uevent.udemigod) {
	    /* all hell breaks loose */
	    return monstr[PM_DEMOGORGON];
	} else if (in_mklev) {
	    /* Strength of initial inhabitants no longer
	     * depends on player level. */
	    return (zlevel > 10) ? ((zlevel - 10) / 2 + 10) : zlevel;
	} else {
	    return (zlevel + u.ulevel) / 2;
	}
}